

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
* __thiscall
testing::internal::UnorderedElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
           *__return_storage_ptr__,UnorderedElementsAreMatcher *this)

{
  UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
  *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  vector<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
  local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
  ::reserve(&local_28,0);
  this_00 = (UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
             *)operator_new(0x40);
  UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
  ::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<int_const,phmap::priv::NonStandardLayout>const&>*,std::vector<testing::Matcher<std::pair<int_const,phmap::priv::NonStandardLayout>const&>,std::allocator<testing::Matcher<std::pair<int_const,phmap::priv::NonStandardLayout>const&>>>>>
            (this_00,ExactMatch,
             (__normal_iterator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0034a328;
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
  ).vtable_ = (VTable *)0x0;
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
  ).buffer_.ptr = (void *)0x0;
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
  ).vtable_ = (VTable *)
              MatcherBase<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
              ::
              GetVTable<testing::internal::MatcherBase<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>::ValuePolicy<testing::MatcherInterface<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>const*,true>>()
              ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
    **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
  ).buffer_.ptr = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0034a2b8;
  std::
  vector<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>,_std::allocator<testing::Matcher<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            UnorderedMatcherRequire::ExactMatch, matchers.begin(),
            matchers.end()));
  }